

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::App::remove_excludes(App *this,App *app)

{
  _Rb_tree_header *p_Var1;
  App *this_00;
  _Rb_tree_const_iterator<CLI::App_*> __position;
  
  p_Var1 = &(this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header;
  __position = ::std::
               __find_if<std::_Rb_tree_const_iterator<CLI::App*>,__gnu_cxx::__ops::_Iter_equals_val<CLI::App*const>>
                         ((this->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_left,p_Var1);
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    this_00 = *(App **)(__position._M_node + 1);
    ::std::
    _Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
    ::erase_abi_cxx11_((_Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
                        *)&this->exclude_subcommands_,(const_iterator)__position._M_node);
    remove_excludes(this_00,this);
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

CLI11_INLINE bool App::remove_excludes(App *app) {
    auto iterator = std::find(std::begin(exclude_subcommands_), std::end(exclude_subcommands_), app);
    if(iterator == std::end(exclude_subcommands_)) {
        return false;
    }
    auto *other_app = *iterator;
    exclude_subcommands_.erase(iterator);
    other_app->remove_excludes(this);
    return true;
}